

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O2

void absl::RemoveExtraAsciiWhitespace(Nonnull<std::string_*> str)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  string_view sVar6;
  
  sVar6._M_str = (str->_M_dataplus)._M_p;
  sVar6._M_len = str->_M_string_length;
  sVar6 = StripAsciiWhitespace(sVar6);
  pbVar2 = (byte *)sVar6._M_str;
  if (sVar6._M_len != 0) {
    pbVar1 = pbVar2 + sVar6._M_len;
    pbVar3 = (byte *)(str->_M_dataplus)._M_p;
    bVar4 = 0;
    for (; pbVar2 < pbVar1; pbVar2 = pbVar2 + 1) {
      bVar5 = ((&ascii_internal::kPropertyBits)[*pbVar2] & 8) >> 3;
      pbVar3[-(ulong)(bVar4 & bVar5)] = *pbVar2;
      pbVar3 = pbVar3 + -(ulong)(bVar4 & bVar5) + 1;
      bVar4 = bVar5;
    }
    std::__cxx11::string::erase((ulong)str,(long)pbVar3 - (long)(str->_M_dataplus)._M_p);
    return;
  }
  str->_M_string_length = 0;
  *(str->_M_dataplus)._M_p = '\0';
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(absl::Nonnull<std::string*> str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}